

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemViewPrivate::fetchMore(QAbstractItemViewPrivate *this)

{
  QPersistentModelIndex *this_00;
  long *plVar1;
  QWidgetData *pQVar2;
  char cVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  QModelIndex *__return_storage_ptr__;
  long in_FS_OFFSET;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  pQVar5 = this->model;
  this_00 = &this->root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  cVar3 = (**(code **)(*(long *)pQVar5 + 0x130))(pQVar5,&local_58);
  if (cVar3 != '\0') {
    pQVar5 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&local_58);
    if (iVar4 < 1) {
      pQVar5 = this->model;
      __return_storage_ptr__ = &local_58;
    }
    else {
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = this->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_58,pQVar5,iVar4 + -1,0,&local_70);
      plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.field_0x8;
      (**(code **)(*plVar1 + 0x1e0))(plVar1,&local_58);
      pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      local_70.i = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                            (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      local_70.r = 0;
      local_70.c = 0;
      cVar3 = QRect::intersects((QRect *)&local_70);
      if (cVar3 == '\0') goto LAB_00535f35;
      pQVar5 = this->model;
      __return_storage_ptr__ = &local_70;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,this_00);
    (**(code **)(*(long *)pQVar5 + 0x128))(pQVar5,__return_storage_ptr__);
  }
LAB_00535f35:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::fetchMore()
{
    fetchMoreTimer.stop();
    if (!model->canFetchMore(root))
        return;
    int last = model->rowCount(root) - 1;
    if (last < 0) {
        model->fetchMore(root);
        return;
    }

    QModelIndex index = model->index(last, 0, root);
    QRect rect = q_func()->visualRect(index);
    if (viewport->rect().intersects(rect))
        model->fetchMore(root);
}